

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

void __thiscall
duckdb::CSVErrorHandler::Error(CSVErrorHandler *this,CSVError *csv_error,bool force_error)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    if ((byte)(this->ignore_errors ^ 1U | force_error) != 1) {
LAB_00bb8733:
      ::std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>::push_back
                (&(this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>,
                 csv_error);
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return;
    }
    if (((this->print_line == true) && (csv_error->type < 9)) &&
       ((0x1ddU >> (csv_error->type & 0x1f) & 1) != 0)) {
      bVar1 = CanGetLine(this,(csv_error->error_info).boundary_idx);
      if (!bVar1) goto LAB_00bb8733;
    }
    ThrowError(this,csv_error);
    iVar2 = extraout_EAX;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

void CSVErrorHandler::Error(const CSVError &csv_error, bool force_error) {
	lock_guard<mutex> parallel_lock(main_mutex);
	if ((ignore_errors && !force_error) || (PrintLineNumber(csv_error) && !CanGetLine(csv_error.GetBoundaryIndex()))) {
		// We store this error, we can't throw it now, or we are ignoring it
		errors.push_back(csv_error);
		return;
	}
	// Otherwise we can throw directly
	ThrowError(csv_error);
}